

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(ImRect *r_in,ImRect *r_outer,float threshold)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 in_EAX;
  undefined4 uVar7;
  byte bVar8;
  undefined4 in_ECX;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar3 = (r_in->Min).x;
  fVar4 = (r_in->Min).y;
  fVar5 = (r_in->Max).x;
  fVar6 = (r_in->Max).y;
  fVar14 = (r_outer->Min).x + threshold;
  fVar15 = (r_outer->Min).y + threshold;
  fVar12 = (r_outer->Max).x - threshold;
  fVar13 = (r_outer->Max).y - threshold;
  auVar1._4_4_ = -(uint)(fVar4 <= fVar15);
  auVar1._0_4_ = -(uint)(fVar3 <= fVar14);
  auVar1._8_4_ = -(uint)(fVar5 <= fVar12);
  auVar1._12_4_ = -(uint)(fVar6 <= fVar13);
  uVar7 = movmskps(in_EAX,auVar1);
  bVar9 = (byte)uVar7;
  bVar10 = (bVar9 & 2) >> 1;
  auVar2._4_4_ = -(uint)(fVar15 <= fVar4);
  auVar2._0_4_ = -(uint)(fVar14 <= fVar3);
  auVar2._8_4_ = -(uint)(fVar12 <= fVar5);
  auVar2._12_4_ = -(uint)(fVar13 <= fVar6);
  uVar7 = movmskps(in_ECX,auVar2);
  bVar11 = ((byte)uVar7 & 8) >> 3;
  bVar8 = ((byte)uVar7 & 4) >> 2;
  return (uint)(bVar8 & bVar11) << 7 |
         (uint)(bVar9 & bVar11) << 6 | (uint)(bVar10 & bVar8) << 5 | (uint)(bVar10 & bVar9) << 4 |
         0x100;
}

Assistant:

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(const ImRect& r_in, const ImRect& r_outer, float threshold)
{
    bool round_l = r_in.Min.x <= r_outer.Min.x + threshold;
    bool round_r = r_in.Max.x >= r_outer.Max.x - threshold;
    bool round_t = r_in.Min.y <= r_outer.Min.y + threshold;
    bool round_b = r_in.Max.y >= r_outer.Max.y - threshold;
    return ImDrawFlags_RoundCornersNone
        | ((round_t && round_l) ? ImDrawFlags_RoundCornersTopLeft : 0) | ((round_t && round_r) ? ImDrawFlags_RoundCornersTopRight : 0)
        | ((round_b && round_l) ? ImDrawFlags_RoundCornersBottomLeft : 0) | ((round_b && round_r) ? ImDrawFlags_RoundCornersBottomRight : 0);
}